

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void merge_cache_lcp_2way<false,unsigned_int>
               (uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uint *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uint *cache_result)

{
  byte bVar1;
  uchar *puVar2;
  uchar *puVar3;
  char *pcVar4;
  lcp_t lVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  size_t sVar9;
  ulong uVar10;
  lcp_t *plVar11;
  uchar **ppuVar12;
  uchar **ppuVar13;
  uchar **ppuVar14;
  uint uVar15;
  uint uVar16;
  lcp_t lcp0;
  long lVar17;
  tuple<int,_unsigned_long> tVar18;
  size_t local_d8;
  ulong local_d0;
  uchar **local_c8;
  lcp_t *local_c0;
  uchar **local_b8;
  size_t local_b0;
  lcp_t *local_98;
  uint32_t *local_90;
  uint *local_88;
  string local_78;
  lcp_t local_58;
  string local_50;
  
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"merge_cache_lcp_2way",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): n0=",7);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", n1=",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  local_78._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_78,1);
  check_input<unsigned_int>(from0,lcp_input0,cache_input0,n0);
  check_input<unsigned_int>(from1,lcp_input1,cache_input1,n1);
  local_88 = cache_input0 + 1;
  uVar16 = *cache_input0;
  local_90 = cache_input1 + 1;
  uVar15 = *cache_input1;
  local_c8 = from1;
  local_98 = lcp_input1;
  if (uVar16 < uVar15) {
    puVar2 = *from0;
    if (puVar2 == (uchar *)0x0) {
LAB_0024a99e:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    puVar3 = *from1;
    if (puVar3 == (uchar *)0x0) {
LAB_0024a9bd:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar6 = strcmp((char *)puVar2,(char *)puVar3);
    if (-1 < iVar6) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    if (uVar16 == uVar15) {
LAB_0024a9fb:
      __assert_fail("a != b or a==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x3ff,"unsigned int lcp(uint32_t, uint32_t)");
    }
    uVar7 = 0;
    if (((uVar16 & 0xff000000) == (uVar15 & 0xff000000) && (uVar16 & 0xff000000) != 0) &&
       (uVar7 = 1, (uVar16 & 0xff0000) == (uVar15 & 0xff0000) && (uVar16 & 0xff0000) != 0)) {
      uVar7 = ((uVar16 & 0xff00) == (uVar15 & 0xff00) && (uVar16 & 0xff00) != 0) | 2;
    }
    local_d0 = (ulong)uVar7;
    if (uVar7 != 0) {
      bVar1 = puVar3[local_d0];
      if (bVar1 == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = (uint)bVar1 << 0x18;
        if (puVar3[local_d0 + 1] != 0) {
          uVar15 = (uint)bVar1 << 0x18 | (uint)puVar3[local_d0 + 1] << 0x10;
          if (puVar3[local_d0 + 2] != '\0') {
            uVar15 = CONCAT11(puVar3[local_d0 + 2],puVar3[local_d0 + 3]) | uVar15;
          }
        }
      }
    }
    *result = puVar2;
    local_d8 = n0 - 1;
    if (local_d8 == 0) {
LAB_00249c4f:
      ppuVar14 = result + 1;
      local_d8 = 0;
      local_b0 = n1;
LAB_0024a88f:
      if (local_d8 != 0) {
        __assert_fail("n0==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51d,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      local_b8 = local_c8;
      local_d8 = local_b0;
      if (local_b0 == 0) {
        __assert_fail("n1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51e,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      goto LAB_0024a8b0;
    }
    from0 = from0 + 1;
    lcp0 = *lcp_input0;
    local_c0 = lcp_input0 + 1;
    uVar16 = cache_input0[1];
    local_88 = cache_input0 + 2;
LAB_00249d71:
    ppuVar14 = result + 1;
    local_b0 = n1;
LAB_00249d90:
    do {
      while( true ) {
        while( true ) {
          ppuVar13 = ppuVar14;
          ppuVar12 = from0;
          lVar17 = 0;
          local_b8 = ppuVar12;
          while( true ) {
            local_58 = lcp0;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Starting loop, n0=",0x12);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", n1=",5);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ...\n",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tprev   = \'",0xb);
            pcVar4 = *(char **)((long)ppuVar13 + lVar17 + -8);
            iVar6 = (int)poVar8;
            if (pcVar4 == (char *)0x0) {
              std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
            }
            else {
              sVar9 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar4,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t*from0 = \'",0xb);
            pcVar4 = *(char **)((long)ppuVar12 + lVar17);
            if (pcVar4 == (char *)0x0) {
              std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
            }
            else {
              sVar9 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar4,sVar9);
            }
            lcp0 = local_58;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t*from1 = \'",0xb);
            puVar2 = *local_c8;
            if (puVar2 == (uchar *)0x0) {
              std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
            }
            else {
              sVar9 = strlen((char *)puVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)puVar2,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0   = ",10);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp1   = ",10);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tcache0 = \'",0xb);
            to_str_abi_cxx11_(&local_78,uVar16);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                                        local_78._M_dataplus._M_p._0_1_),
                                CONCAT44(local_78._M_string_length._4_4_,
                                         (int)local_78._M_string_length));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tcache1 = \'",0xb);
            to_str_abi_cxx11_(&local_50,uVar15);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_50._M_dataplus._M_p,local_50._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
                &local_78.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                       local_78._M_dataplus._M_p._0_1_));
            }
            check_lcp_and_cache<unsigned_int>
                      (*(uchar **)((long)ppuVar13 + lVar17 + -8),
                       *(uchar **)((long)ppuVar12 + lVar17),lcp0,uVar16,*local_c8,local_d0,uVar15);
            if (lcp0 <= local_d0) break;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0 > lcp1\n",0xd);
            pcVar4 = *(char **)((long)ppuVar12 + lVar17);
            if (pcVar4 == (char *)0x0) goto LAB_0024a99e;
            if (*local_c8 == (uchar *)0x0) goto LAB_0024a9bd;
            iVar6 = strcmp(pcVar4,(char *)*local_c8);
            if (-1 < iVar6) {
              __assert_fail("cmp(*from0, *from1) < 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4ae,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                           );
            }
            local_b8 = local_b8 + 1;
            *(char **)((long)ppuVar13 + lVar17) = pcVar4;
            lcp0 = *(lcp_t *)((long)local_c0 + lVar17);
            uVar16 = *local_88;
            local_88 = local_88 + 1;
            lVar17 = lVar17 + 8;
            local_d8 = local_d8 - 1;
            if (local_d8 == 0) {
              ppuVar14 = (uchar **)((long)ppuVar13 + lVar17);
              goto LAB_0024a881;
            }
          }
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          if (local_d0 <= lcp0) break;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0 < lcp1\n",0xd);
          if (*(char **)((long)ppuVar12 + lVar17) == (char *)0x0) goto LAB_0024a99e;
          puVar2 = *local_c8;
          if (puVar2 == (uchar *)0x0) goto LAB_0024a9bd;
          iVar6 = strcmp(*(char **)((long)ppuVar12 + lVar17),(char *)puVar2);
          if (iVar6 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4b7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                         );
          }
          local_c0 = (lcp_t *)((long)local_c0 + lVar17);
          local_c8 = local_c8 + 1;
          *(undefined8 *)((long)ppuVar13 + lVar17) = puVar2;
          local_d0 = *local_98;
          local_98 = local_98 + 1;
          uVar15 = *local_90;
          local_90 = local_90 + 1;
          local_b0 = local_b0 - 1;
          from0 = (uchar **)((long)ppuVar12 + lVar17);
          ppuVar14 = (uchar **)((undefined8 *)((long)ppuVar13 + lVar17) + 1);
          if (local_b0 == 0) {
            ppuVar14 = (uchar **)((long)ppuVar13 + lVar17 + 8);
            goto LAB_0024a963;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0 == lcp1\n",0xe);
        if (uVar15 <= uVar16) break;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tcache0 < cache1\n",0x12);
        pcVar4 = *(char **)((long)ppuVar12 + lVar17);
        if (pcVar4 == (char *)0x0) goto LAB_0024a99e;
        puVar2 = *local_c8;
        if (puVar2 == (uchar *)0x0) goto LAB_0024a9bd;
        iVar6 = strcmp(pcVar4,(char *)puVar2);
        if (-1 < iVar6) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4c6,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                       );
        }
        uVar7 = 0;
        if (((uVar16 & 0xff000000) != 0) && ((uVar16 & 0xff000000) == (uVar15 & 0xff000000))) {
          uVar7 = 1;
          if (((uVar16 & 0xff0000) != 0) && ((uVar16 & 0xff0000) == (uVar15 & 0xff0000))) {
            uVar7 = ((uVar16 & 0xff00) == (uVar15 & 0xff00) && (uVar16 & 0xff00) != 0) | 2;
          }
        }
        if (uVar7 != 0) {
          local_d0 = local_d0 + uVar7;
          bVar1 = puVar2[local_d0];
          if (bVar1 == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = (uint)bVar1 << 0x18;
            if (puVar2[local_d0 + 1] != 0) {
              uVar15 = (uint)bVar1 << 0x18 | (uint)puVar2[local_d0 + 1] << 0x10;
              if (puVar2[local_d0 + 2] != '\0') {
                uVar15 = uVar15 | CONCAT11(puVar2[local_d0 + 2],puVar2[local_d0 + 3]);
              }
            }
          }
        }
        *(char **)((long)ppuVar13 + lVar17) = pcVar4;
        if (local_d8 == 1) {
          ppuVar14 = (uchar **)((long)ppuVar13 + lVar17 + 8);
LAB_0024a881:
          local_d8 = 0;
          goto LAB_0024a88f;
        }
        lcp0 = *(lcp_t *)((long)local_c0 + lVar17);
LAB_0024a439:
        local_d8 = local_d8 - 1;
        uVar16 = *local_88;
        local_88 = local_88 + 1;
        from0 = (uchar **)((long)ppuVar12 + lVar17 + 8);
        ppuVar14 = (uchar **)((long)ppuVar13 + lVar17 + 8);
        local_c0 = (lcp_t *)((long)local_c0 + lVar17 + 8);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      if (uVar16 <= uVar15) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tcache0 == cache1\n",0x13);
        if ((char)uVar16 == '\0') {
          pcVar4 = *(char **)((long)ppuVar12 + lVar17);
          if (pcVar4 != (char *)0x0) {
            if (*local_c8 != (uchar *)0x0) {
              iVar6 = strcmp(pcVar4,(char *)*local_c8);
              if (iVar6 != 0) {
                __assert_fail("cmp(*from0, *from1) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4e7,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                             );
              }
              *(char **)((long)ppuVar13 + lVar17) = pcVar4;
              lcp0 = *(lcp_t *)((long)local_c0 + lVar17);
              if ((uVar16 == 0) || (uVar16 != uVar15)) {
                if ((uVar16 & 0xff000000) == 0) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = 0;
                  if ((uVar16 & 0xff000000) == (uVar15 & 0xff000000)) {
                    uVar10 = 1;
                    if (((uVar16 & 0xff0000) != 0) && ((uVar16 & 0xff0000) == (uVar15 & 0xff0000)))
                    {
                      uVar10 = (ulong)((uVar16 & 0xff00) == (uVar15 & 0xff00) &&
                                      (uVar16 & 0xff00) != 0) | 2;
                    }
                  }
                }
                if (local_d8 != 1) {
                  local_d0 = local_d0 + uVar10;
                  uVar15 = 0;
                  goto LAB_0024a439;
                }
                ppuVar14 = (uchar **)((long)ppuVar13 + lVar17 + 8);
                goto LAB_0024a881;
              }
              goto LAB_0024a9fb;
            }
            goto LAB_0024a9bd;
          }
          goto LAB_0024a99e;
        }
        local_b8 = (uchar **)(lVar17 + (long)ppuVar12);
        compare((uchar *)&local_78,*(uchar **)((long)ppuVar12 + lVar17),(size_t)*local_c8);
        local_d0 = CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_);
        plVar11 = (lcp_t *)((long)local_c0 + lVar17);
        if ((int)local_78._M_string_length < 0) {
          *(undefined8 *)((long)ppuVar13 + lVar17) = *(undefined8 *)((long)ppuVar12 + lVar17);
          puVar2 = *local_c8;
          if (puVar2 == (uchar *)0x0) goto LAB_0024ab12;
          bVar1 = puVar2[local_d0];
          if (bVar1 == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = (uint)bVar1 << 0x18;
            if (puVar2[local_d0 + 1] != 0) {
              uVar15 = (uint)puVar2[local_d0 + 1] << 0x10 | (uint)bVar1 << 0x18;
              if (puVar2[local_d0 + 2] != '\0') {
                uVar15 = CONCAT11(puVar2[local_d0 + 2],puVar2[local_d0 + 3]) | uVar15;
              }
            }
          }
          ppuVar14 = (uchar **)((long)ppuVar13 + lVar17 + 8);
          plVar11 = (lcp_t *)((long)local_c0 + lVar17 + 8);
          lcp0 = plVar11[-1];
          uVar16 = *local_88;
LAB_0024a827:
          local_88 = local_88 + 1;
          local_b8 = (uchar **)((long)ppuVar12 + lVar17 + 8);
          if (local_d8 == 1) {
            iVar6 = 2;
            local_d8 = 0;
          }
          else {
            local_d8 = local_d8 - 1;
            lVar5 = local_d0;
LAB_0024a84f:
            local_d0 = lVar5;
            iVar6 = 0;
          }
        }
        else {
          ppuVar14 = (uchar **)((long)ppuVar13 + lVar17 + 8);
          if ((int)local_78._M_string_length == 0) {
            *(undefined8 *)((long)ppuVar13 + lVar17) = *(undefined8 *)(lVar17 + (long)ppuVar12);
            plVar11 = (lcp_t *)((long)local_c0 + lVar17 + 8);
            lcp0 = plVar11[-1];
            uVar16 = *local_88;
            uVar15 = 0;
            goto LAB_0024a827;
          }
          *(uchar **)((long)ppuVar13 + lVar17) = *local_c8;
          puVar2 = *local_b8;
          if (puVar2 == (uchar *)0x0) goto LAB_0024ab12;
          if (puVar2[local_d0] == 0) {
            uVar16 = 0;
          }
          else {
            uVar16 = (uint)puVar2[local_d0] << 0x18;
            if (puVar2[local_d0 + 1] != 0) {
              uVar16 = uVar16 | (uint)puVar2[local_d0 + 1] << 0x10;
              if (puVar2[local_d0 + 2] != '\0') {
                uVar16 = uVar16 | CONCAT11(puVar2[local_d0 + 2],puVar2[local_d0 + 3]);
              }
            }
          }
          local_c8 = local_c8 + 1;
          lVar5 = *local_98;
          local_98 = local_98 + 1;
          uVar15 = *local_90;
          local_90 = local_90 + 1;
          local_b0 = local_b0 - 1;
          lcp0 = local_d0;
          if (local_b0 != 0) goto LAB_0024a84f;
          iVar6 = 3;
          local_b0 = 0;
          local_d0 = lVar5;
        }
        from0 = local_b8;
        local_c0 = plVar11;
        if (iVar6 != 0) {
          if (iVar6 == 1) {
            return;
          }
          if (iVar6 == 2) goto LAB_0024a88f;
          goto LAB_0024a96b;
        }
        goto LAB_00249d90;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tcache0 > cache1\n",0x12);
      pcVar4 = *(char **)((long)ppuVar12 + lVar17);
      if (pcVar4 == (char *)0x0) goto LAB_0024a99e;
      puVar2 = *local_c8;
      if (puVar2 == (uchar *)0x0) goto LAB_0024a9bd;
      iVar6 = strcmp(pcVar4,(char *)puVar2);
      if (iVar6 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4d6,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      uVar7 = 0;
      if (((uVar16 & 0xff000000) != 0) && ((uVar16 & 0xff000000) == (uVar15 & 0xff000000))) {
        uVar7 = 1;
        if (((uVar16 & 0xff0000) != 0) && ((uVar16 & 0xff0000) == (uVar15 & 0xff0000))) {
          uVar7 = ((uVar16 & 0xff00) == (uVar15 & 0xff00) && (uVar16 & 0xff00) != 0) | 2;
        }
      }
      if (uVar7 != 0) {
        lcp0 = lcp0 + uVar7;
        if (pcVar4[lcp0] == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = (uint)(byte)pcVar4[lcp0] << 0x18;
          if (pcVar4[lcp0 + 1] != 0) {
            uVar16 = uVar16 | (uint)(byte)pcVar4[lcp0 + 1] << 0x10;
            if (pcVar4[lcp0 + 2] != '\0') {
              uVar16 = uVar16 | CONCAT11(pcVar4[lcp0 + 2],pcVar4[lcp0 + 3]);
            }
          }
        }
      }
      local_c0 = (lcp_t *)((long)local_c0 + lVar17);
      local_c8 = local_c8 + 1;
      *(undefined8 *)((long)ppuVar13 + lVar17) = puVar2;
      local_d0 = *local_98;
      local_98 = local_98 + 1;
      uVar15 = *local_90;
      local_90 = local_90 + 1;
      local_b0 = local_b0 - 1;
      from0 = (uchar **)(lVar17 + (long)ppuVar12);
      ppuVar14 = (uchar **)((undefined8 *)((long)ppuVar13 + lVar17) + 1);
    } while (local_b0 != 0);
    ppuVar14 = (uchar **)((long)ppuVar13 + lVar17 + 8);
    local_b8 = (uchar **)((long)ppuVar12 + lVar17);
    local_b0 = 0;
  }
  else {
    if (uVar16 <= uVar15) {
      if ((char)uVar16 != '\0') {
        tVar18 = compare((uchar *)&local_78,*from0,(size_t)*from1);
        ppuVar14 = tVar18.super__Tuple_impl<0UL,_int,_unsigned_long>._8_8_;
        lVar17 = CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_);
        if ((int)local_78._M_string_length < 0) {
          *result = *from0;
          puVar2 = *from1;
          if (puVar2 == (uchar *)0x0) {
LAB_0024ab12:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x38,"uint32_t get_char(unsigned char *, size_t)");
          }
          bVar1 = puVar2[lVar17];
          if (bVar1 == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = (uint)bVar1 << 0x18;
            if (puVar2[lVar17 + 1] != 0) {
              uVar15 = (uint)puVar2[lVar17 + 1] << 0x10 | (uint)bVar1 << 0x18;
              bVar1 = puVar2[lVar17 + 2];
              ppuVar14 = (uchar **)(ulong)bVar1;
              if (bVar1 != 0) {
                ppuVar14 = (uchar **)((ulong)bVar1 << 8);
                uVar15 = (uint)puVar2[lVar17 + 3] | (uint)ppuVar14 | uVar15;
              }
            }
          }
          from0 = from0 + 1;
          uVar16 = cache_input0[1];
          if (n0 == 1) {
            lVar17 = 2;
            goto LAB_00249d5f;
          }
        }
        else if ((int)local_78._M_string_length == 0) {
          puVar2 = *from0;
          from0 = from0 + 1;
          *result = puVar2;
          uVar16 = cache_input0[1];
          uVar15 = 0;
          ppuVar14 = result;
          if (n0 == 1) {
            lVar17 = 2;
            goto LAB_00249d5f;
          }
        }
        else {
          *result = *from1;
          puVar2 = *from0;
          if (puVar2 == (uchar *)0x0) goto LAB_0024ab12;
          bVar1 = puVar2[lVar17];
          if (bVar1 == 0) {
            uVar16 = 0;
          }
          else {
            uVar16 = (uint)bVar1 << 0x18;
            if (puVar2[lVar17 + 1] != 0) {
              uVar16 = (uint)bVar1 << 0x18 | (uint)puVar2[lVar17 + 1] << 0x10;
              if (puVar2[lVar17 + 2] != '\0') {
                uVar16 = uVar16 | CONCAT11(puVar2[lVar17 + 2],puVar2[lVar17 + 3]);
              }
            }
          }
          ppuVar14 = (uchar **)*lcp_input1;
          uVar15 = cache_input1[1];
          if (n1 == 1) {
            lVar17 = 3;
            goto LAB_00249d5f;
          }
        }
        lVar17 = 0;
LAB_00249d5f:
        (*(code *)((long)&DAT_00269030 + (long)(int)(&DAT_00269030)[lVar17]))
                  (result + 1,from0,ppuVar14,&DAT_00269030,uVar15,uVar16);
        return;
      }
      puVar2 = *from0;
      if (puVar2 == (uchar *)0x0) goto LAB_0024a99e;
      if (*from1 == (uchar *)0x0) goto LAB_0024a9bd;
      iVar6 = strcmp((char *)puVar2,(char *)*from1);
      if (iVar6 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      if (uVar16 != 0 && uVar16 == uVar15) goto LAB_0024a9fb;
      if ((uVar16 & 0xff000000) == (uVar15 & 0xff000000) && (uVar16 & 0xff000000) != 0) {
        local_d0 = 1;
        if ((uVar16 & 0xff0000) == (uVar15 & 0xff0000) && (uVar16 & 0xff0000) != 0) {
          local_d0 = (ulong)((uVar16 & 0xff00) == (uVar15 & 0xff00) && (uVar16 & 0xff00) != 0) | 2;
        }
      }
      else {
        local_d0 = 0;
      }
      *result = puVar2;
      local_d8 = n0 - 1;
      if (local_d8 == 0) goto LAB_00249c4f;
      from0 = from0 + 1;
      lcp0 = *lcp_input0;
      local_c0 = lcp_input0 + 1;
      uVar16 = cache_input0[1];
      local_88 = cache_input0 + 2;
      uVar15 = 0;
      goto LAB_00249d71;
    }
    puVar2 = *from0;
    if (puVar2 == (uchar *)0x0) goto LAB_0024a99e;
    puVar3 = *from1;
    if (puVar3 == (uchar *)0x0) goto LAB_0024a9bd;
    iVar6 = strcmp((char *)puVar2,(char *)puVar3);
    if (iVar6 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    if (uVar16 == uVar15) goto LAB_0024a9fb;
    uVar7 = 0;
    if (((uVar16 & 0xff000000) == (uVar15 & 0xff000000) && (uVar16 & 0xff000000) != 0) &&
       (uVar7 = 1, (uVar16 & 0xff0000) == (uVar15 & 0xff0000) && (uVar16 & 0xff0000) != 0)) {
      uVar7 = ((uVar16 & 0xff00) == (uVar15 & 0xff00) && (uVar16 & 0xff00) != 0) | 2;
    }
    lcp0 = (lcp_t)uVar7;
    if (uVar7 != 0) {
      if (puVar2[lcp0] == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = (uint)puVar2[lcp0] << 0x18;
        if (puVar2[lcp0 + 1] != 0) {
          uVar16 = uVar16 | (uint)puVar2[lcp0 + 1] << 0x10;
          if (puVar2[lcp0 + 2] != '\0') {
            uVar16 = uVar16 | CONCAT11(puVar2[lcp0 + 2],puVar2[lcp0 + 3]);
          }
        }
      }
    }
    *result = puVar3;
    ppuVar14 = result + 1;
    n1 = n1 - 1;
    local_d8 = n0;
    local_b8 = from0;
    if (n1 != 0) {
      local_c8 = from1 + 1;
      local_d0 = *lcp_input1;
      local_98 = lcp_input1 + 1;
      uVar15 = cache_input1[1];
      local_90 = cache_input1 + 2;
      local_c0 = lcp_input0;
      goto LAB_00249d71;
    }
LAB_0024a963:
    local_b0 = 0;
  }
LAB_0024a96b:
  if (local_d8 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                 );
  }
  if (local_b0 != 0) {
    __assert_fail("n1==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x528,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                 );
  }
LAB_0024a8b0:
  memmove(ppuVar14,local_b8,local_d8 << 3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_78._M_dataplus._M_p._0_1_ = 0x7e;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_78,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"merge_cache_lcp_2way",0x14);
  local_78._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_78,1);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}